

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::makeCooperativeMatrixTypeWithSameShape(Builder *this,Id component,Id otherType)

{
  Instruction *pIVar1;
  ulong uVar2;
  long lVar3;
  Id IVar4;
  
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[otherType];
  if (pIVar1->opCode == OpTypeCooperativeMatrixKHR) {
    uVar2 = **(ulong **)
              &(pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data;
    if (((((uVar2 & 2) != 0) && ((uVar2 & 4) != 0)) && ((uVar2 & 8) != 0)) && ((uVar2 & 0x10) != 0))
    {
      lVar3 = *(long *)&(pIVar1->operands).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      IVar4 = makeCooperativeMatrixTypeKHR
                        (this,component,*(Id *)(lVar3 + 4),*(Id *)(lVar3 + 8),*(Id *)(lVar3 + 0xc),
                         *(Id *)(lVar3 + 0x10));
      return IVar4;
    }
  }
  else {
    if (pIVar1->opCode != OpTypeCooperativeMatrixNV) {
      __assert_fail("instr->getOpCode() == OpTypeCooperativeMatrixKHR",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x201,"Id spv::Builder::makeCooperativeMatrixTypeWithSameShape(Id, Id)");
    }
    uVar2 = **(ulong **)
              &(pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data;
    if ((((uVar2 & 2) != 0) && ((uVar2 & 4) != 0)) && ((uVar2 & 8) != 0)) {
      lVar3 = *(long *)&(pIVar1->operands).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      IVar4 = makeCooperativeMatrixTypeNV
                        (this,component,*(Id *)(lVar3 + 4),*(Id *)(lVar3 + 8),*(Id *)(lVar3 + 0xc));
      return IVar4;
    }
  }
  __assert_fail("idOperand[op]",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
}

Assistant:

Id Builder::makeCooperativeMatrixTypeWithSameShape(Id component, Id otherType)
{
    Instruction* instr = module.getInstruction(otherType);
    if (instr->getOpCode() == OpTypeCooperativeMatrixNV) {
        return makeCooperativeMatrixTypeNV(component, instr->getIdOperand(1), instr->getIdOperand(2), instr->getIdOperand(3));
    } else {
        assert(instr->getOpCode() == OpTypeCooperativeMatrixKHR);
        return makeCooperativeMatrixTypeKHR(component, instr->getIdOperand(1), instr->getIdOperand(2), instr->getIdOperand(3), instr->getIdOperand(4));
    }
}